

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O2

pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
* __thiscall
Jinx::Impl::Script::WalkSubscripts
          (pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
           *__return_storage_ptr__,Script *this,uint32_t subscripts,CollectionPtr *collection)

{
  pointer pVVar1;
  _Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
  *this_00;
  bool bVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  Variant newColl;
  Variant key;
  undefined1 local_a8 [80];
  Variant local_58;
  
  key.m_type = Null;
  uVar4 = 0;
  uVar5 = (ulong)subscripts;
  do {
    if (uVar5 == 0) {
      while (bVar2 = subscripts != 0, subscripts = subscripts - 1, bVar2) {
        Pop(&local_58,this);
        Variant::~Variant(&local_58);
      }
      std::
      pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>,_Jinx::Variant>
      ::
      pair<std::shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>_&,_Jinx::Variant_&,_true>
                (__return_storage_ptr__,collection,&key);
LAB_0010d3be:
      Variant::~Variant(&key);
      return __return_storage_ptr__;
    }
    pVVar1 = (this->m_stack).
             super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>.
             _M_impl.super__Vector_impl_data._M_start;
    Variant::operator=(&key,pVVar1 + (((long)(this->m_stack).
                                             super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pVVar1) / 0x28 - (uVar5 & 0xffffffff)));
    bVar2 = Variant::IsKeyType(&key);
    if (!bVar2) {
      Error(this,"Invalid key type");
LAB_0010d3af:
      (__return_storage_ptr__->first).
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (__return_storage_ptr__->first).
      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->second).m_type = Null;
      goto LAB_0010d3be;
    }
    if (uVar4 < subscripts - 1) {
      iVar3 = std::
              _Rb_tree<Jinx::Variant,_std::pair<const_Jinx::Variant,_Jinx::Variant>,_std::_Select1st<std::pair<const_Jinx::Variant,_Jinx::Variant>_>,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
              ::find(&((collection->
                       super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->_M_t,&key);
      if ((_Rb_tree_header *)iVar3._M_node ==
          &(((collection->
             super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->_M_t)._M_impl.super__Rb_tree_header) {
        CreateCollection();
        Variant::Variant(&newColl,(CollectionPtr *)local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
        this_00 = (_Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
                   *)(collection->
                     super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
        std::pair<Jinx::Variant,_Jinx::Variant>::pair<Jinx::Variant_&,_Jinx::Variant_&,_true>
                  ((pair<Jinx::Variant,_Jinx::Variant> *)local_a8,&key,&newColl);
        std::
        _Rb_tree<Jinx::Variant,std::pair<Jinx::Variant_const,Jinx::Variant>,std::_Select1st<std::pair<Jinx::Variant_const,Jinx::Variant>>,std::less<Jinx::Variant>,Jinx::Allocator<std::pair<Jinx::Variant_const,Jinx::Variant>>>
        ::_M_emplace_unique<std::pair<Jinx::Variant,Jinx::Variant>>
                  (this_00,(pair<Jinx::Variant,_Jinx::Variant> *)local_a8);
        std::pair<Jinx::Variant,_Jinx::Variant>::~pair
                  ((pair<Jinx::Variant,_Jinx::Variant> *)local_a8);
        Variant::GetCollection((Variant *)local_a8);
        std::
        __shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&collection->
                     super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ,(__shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
        Variant::~Variant(&newColl);
      }
      else {
        if (*(int *)&iVar3._M_node[2]._M_parent != 5) {
          Error(this,"Expected collection when accessing by key");
          goto LAB_0010d3af;
        }
        Variant::GetCollection((Variant *)local_a8);
        std::
        __shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&collection->
                     super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ,(__shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)local_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
      }
    }
    uVar4 = uVar4 + 1;
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

inline_t std::pair<CollectionPtr, Variant> Script::WalkSubscripts(uint32_t subscripts, CollectionPtr collection)
	{
		// Walk up through subsequent subscript operators, then pops the keys off the stack and 
		// returns the final collection and key pair,
		Variant key;

		// Loop through the number of subscript operations used
		for (uint32_t i = 0; i < subscripts; ++i)
		{
			// Grab the appropriate key in the stack for this subscript 
			size_t index = m_stack.size() - (subscripts - i);
			key = m_stack[index];
			if (!key.IsKeyType())
			{
				Error("Invalid key type");
				return {};
			}

			// We only need to retrieve a new collection and key set if
			// this isn't the last operation.
			if (i < (subscripts - 1))
			{
				auto itr = collection->find(key);
				if (itr == collection->end())
				{
					Variant newColl = CreateCollection();
					collection->insert(std::make_pair(key, newColl));
					collection = newColl.GetCollection();
				}
				else if (itr->second.IsCollection())
				{
					collection = itr->second.GetCollection();
				}
				else
				{
					Error("Expected collection when accessing by key");
					return {};
				}
			}
		}

		// Pop keys off the stack
		for (uint32_t i = 0; i < subscripts; ++i)
			Pop();

		// Return the final collection and key pair
		return std::make_pair(collection, key);
	}